

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimitiveExpression.h
# Opt level: O3

void __thiscall PrimitiveExpression<String>::~PrimitiveExpression(PrimitiveExpression<String> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_Expression)._vptr_Expression = (_func_int **)&PTR_evaluate_001306c0;
  (this->value).super_Value.super_Member._vptr_Member = (_func_int **)&PTR__String_0012f370;
  pcVar2 = (this->value).value._M_dataplus._M_p;
  paVar1 = &(this->value).value.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x30);
  return;
}

Assistant:

PrimitiveExpression() = default;